

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_common.h
# Opt level: O2

void get_txb_ctx(BLOCK_SIZE plane_bsize,TX_SIZE tx_size,int plane,ENTROPY_CONTEXT *a,
                ENTROPY_CONTEXT *l,TXB_CTX *txb_ctx)

{
  uint uVar1;
  undefined1 auVar2 [13];
  uint3 uVar3;
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  uint5 uVar7;
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  byte bVar10;
  int top;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  undefined7 in_register_00000031;
  long lVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  undefined4 uVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  switch(CONCAT71(in_register_00000031,tx_size) & 0xffffffff) {
  case 0:
    txb_ctx->dc_sign_ctx =
         (int)(char)get_txb_ctx_general_dc_sign_contexts
                    [(long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)*l >> 3)) +
                     (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)*a >> 3)) +
                     0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_4X4) {
        uVar12 = (uint)(*a & 7U);
        if (3 < (*a & 7U)) {
          uVar12 = 4;
        }
        uVar15 = 4;
        if ((*l & 7U) < 4) {
          uVar15 = (uint)(*l & 7U);
        }
        uVar13 = (ulong)uVar12;
        uVar16 = (ulong)uVar15;
LAB_0021db36:
        uVar12 = (uint)(byte)get_txb_ctx_general_skip_contexts[uVar16 + uVar13 * 5];
        goto LAB_0021dc18;
      }
LAB_0021daf5:
      uVar12 = 0;
      goto LAB_0021dc18;
    }
    iVar11 = ((uint)(plane_bsize != BLOCK_4X4) * 3 + 1) - (uint)(*a == '\0');
    bVar20 = *l == '\0';
    break;
  case 1:
    lVar17 = 0;
    uVar13 = 0;
    bVar20 = true;
    do {
      bVar21 = bVar20;
      uVar13 = (ulong)(uint)((int)uVar13 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)((byte)a[lVar17] >> 3)));
      lVar17 = 1;
      bVar20 = false;
    } while (bVar21);
    lVar17 = 0;
    bVar20 = true;
    do {
      bVar21 = bVar20;
      uVar13 = (long)(int)uVar13 +
               (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)l[lVar17] >> 3));
      lVar17 = 1;
      bVar20 = false;
    } while (bVar21);
    txb_ctx->dc_sign_ctx = (int)(char)get_txb_ctx_general_dc_sign_contexts[uVar13 + 0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_8X8) {
        bVar10 = (a[1] | *a) & 7;
        bVar14 = l[1] | *l;
        uVar12 = (uint)bVar10;
        if (3 < bVar10) {
          uVar12 = 4;
        }
LAB_0021dac2:
        uVar15 = 4;
        if ((bVar14 & 7) < 4) {
          uVar15 = (uint)(bVar14 & 7);
        }
        uVar12 = (uint)(byte)get_txb_ctx_general_skip_contexts[(ulong)uVar15 + (ulong)uVar12 * 5];
        goto LAB_0021dc18;
      }
      goto LAB_0021daf5;
    }
    iVar11 = ((uint)((0x3cfff0UL >> ((ulong)plane_bsize & 0x3f) & 1) != 0) * 3 + 1) -
             (uint)(*(short *)a == 0);
    bVar20 = *(short *)l == 0;
    break;
  case 2:
    lVar17 = 0;
    uVar13 = 0;
    do {
      uVar13 = (ulong)(uint)((int)uVar13 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)((byte)a[lVar17] >> 3)));
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    lVar17 = 0;
    do {
      uVar13 = (long)(int)uVar13 +
               (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)l[lVar17] >> 3));
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    txb_ctx->dc_sign_ctx = (int)(char)get_txb_ctx_general_dc_sign_contexts[uVar13 + 0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_16X16) {
        uVar12 = *(uint *)a >> 0x10 | *(uint *)a;
        bVar10 = ((byte)(uVar12 >> 8) | (byte)uVar12) & 7;
        uVar12 = *(uint *)l >> 0x10 | *(uint *)l;
        bVar14 = (byte)(uVar12 >> 8) | (byte)uVar12;
        uVar12 = (uint)bVar10;
        if (3 < bVar10) {
          uVar12 = 4;
        }
        goto LAB_0021dac2;
      }
      goto LAB_0021daf5;
    }
    iVar11 = ((uint)((0x30ff80UL >> ((ulong)plane_bsize & 0x3f) & 1) != 0) * 3 + 1) -
             (uint)(*(int *)a == 0);
    bVar20 = *(int *)l == 0;
    break;
  case 3:
    lVar17 = 0;
    uVar13 = 0;
    do {
      uVar13 = (ulong)(uint)((int)uVar13 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)((byte)a[lVar17] >> 3)));
      lVar17 = lVar17 + 1;
    } while (lVar17 != 8);
    lVar17 = 0;
    do {
      uVar13 = (long)(int)uVar13 +
               (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)l[lVar17] >> 3));
      lVar17 = lVar17 + 1;
    } while (lVar17 != 8);
    txb_ctx->dc_sign_ctx = (int)(char)get_txb_ctx_general_dc_sign_contexts[uVar13 + 0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_32X32) {
        uVar12 = *(uint *)a | *(uint *)(a + 4);
        auVar2[0xc] = (char)(uVar12 >> 0x18);
        auVar2._0_12_ = ZEXT712(0);
        uVar7 = CONCAT32(auVar2._10_3_,(ushort)(byte)(uVar12 >> 0x10));
        auVar9._5_8_ = 0;
        auVar9._0_5_ = uVar7;
        auVar22[5] = 0;
        auVar22[4] = (byte)(uVar12 >> 8);
        auVar22._6_7_ = SUB137(auVar9 << 0x40,6);
        auVar22._0_4_ = uVar12 & 0xff;
        auVar22._13_3_ = 0;
        uVar24 = (undefined4)uVar7;
        uVar3 = auVar2._10_3_ >> 0x10;
        auVar26._4_3_ = uVar3;
        auVar26._0_4_ = uVar24;
        auVar26[7] = 0;
        auVar26._8_4_ = uVar24;
        auVar26._12_3_ = uVar3;
        auVar26[0xf] = 0;
        uVar12 = SUB164(auVar26 | auVar22,4) | SUB164(auVar26 | auVar22,0);
        uVar15 = *(uint *)l | *(uint *)(l + 4);
        uVar13 = (ulong)(ushort)uVar15 & 0xffffffffffff00ff;
        auVar4._8_4_ = 0;
        auVar4._0_8_ = uVar13;
        auVar4[0xc] = (char)(uVar15 >> 0x18);
        auVar5[8] = (char)(uVar15 >> 0x10);
        auVar5._0_8_ = uVar13;
        auVar5[9] = 0;
        auVar5._10_3_ = auVar4._10_3_;
        auVar8._5_8_ = 0;
        auVar8._0_5_ = auVar5._8_5_;
        auVar23._0_4_ = (undefined4)uVar13;
        auVar6[4] = (char)(uVar15 >> 8);
        auVar6._0_4_ = auVar23._0_4_;
        auVar6[5] = 0;
        auVar6._6_7_ = SUB137(auVar8 << 0x40,6);
        auVar23._4_9_ = auVar6._4_9_;
        auVar23._13_3_ = 0;
        uVar3 = auVar4._10_3_ >> 0x10;
        auVar25._4_3_ = uVar3;
        auVar25._0_4_ = auVar5._8_4_;
        auVar25[7] = 0;
        auVar25._8_4_ = auVar5._8_4_;
        auVar25._12_3_ = uVar3;
        auVar25[0xf] = 0;
        uVar15 = SUB164(auVar25 | auVar23,4) | SUB164(auVar25 | auVar23,0);
LAB_0021db21:
        uVar1 = uVar12 & 7;
        if (3 < (uVar12 & 7)) {
          uVar1 = 4;
        }
        uVar13 = (ulong)uVar1;
        uVar16 = (ulong)(uVar15 & 7);
        if (3 < (uVar15 & 7)) {
          uVar16 = 4;
        }
        goto LAB_0021db36;
      }
      goto LAB_0021daf5;
    }
    iVar11 = ((uint)((ulong)plane_bsize - 10 < 6) * 3 + 1) - (uint)(*(long *)a == 0);
    bVar20 = *(long *)l == 0;
    break;
  default:
    uVar13 = (ulong)tx_size;
    lVar18 = (long)*(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    lVar17 = (long)*(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    lVar19 = 0;
    uVar16 = 0;
    do {
      uVar16 = (ulong)(uint)((int)uVar16 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)((byte)a[lVar19] >> 3)));
      lVar19 = lVar19 + 1;
    } while (lVar19 < lVar18);
    lVar19 = 0;
    do {
      uVar16 = (long)(int)uVar16 +
               (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)l[lVar19] >> 3));
      lVar19 = lVar19 + 1;
    } while (lVar19 < lVar17);
    txb_ctx->dc_sign_ctx = (int)(char)get_txb_ctx_general_dc_sign_contexts[uVar16 + 0x20];
    if (plane == 0) {
      if (txsize_to_bsize[uVar13] != plane_bsize) {
        lVar19 = 0;
        uVar12 = 0;
        do {
          uVar12 = uVar12 | (byte)a[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 < lVar18);
        lVar18 = 0;
        uVar15 = 0;
        do {
          uVar15 = uVar15 | (byte)l[lVar18];
          lVar18 = lVar18 + 1;
        } while (lVar18 < lVar17);
        goto LAB_0021db21;
      }
      goto LAB_0021daf5;
    }
    switch(uVar13) {
    case 0:
      bVar20 = *a == '\0';
      goto LAB_0021dbb9;
    case 1:
      bVar20 = *(short *)a == 0;
      goto LAB_0021dbdb;
    case 2:
      bVar20 = *(int *)a == 0;
      break;
    case 3:
      bVar20 = *(long *)a == 0;
      goto LAB_0021db87;
    case 4:
      bVar20 = *(long *)(a + 8) == 0 && *(long *)a == 0;
      goto LAB_0021db9f;
    case 5:
      bVar20 = *a == '\0';
      goto LAB_0021dbdb;
    case 6:
      bVar20 = *(short *)a == 0;
      goto LAB_0021dbb9;
    case 7:
      bVar20 = *(short *)a == 0;
      break;
    case 8:
      bVar20 = *(int *)a == 0;
      goto LAB_0021dbdb;
    case 9:
      bVar20 = *(int *)a == 0;
      goto LAB_0021db87;
    case 10:
      bVar20 = *(long *)a == 0;
      break;
    case 0xb:
      bVar20 = *(long *)a == 0;
      goto LAB_0021db9f;
    case 0xc:
      bVar20 = *(long *)(a + 8) == 0 && *(long *)a == 0;
      goto LAB_0021db87;
    case 0xd:
      bVar20 = *a == '\0';
      break;
    case 0xe:
      bVar20 = *(int *)a == 0;
LAB_0021dbb9:
      bVar20 = !bVar20;
      bVar21 = *l == '\0';
      goto LAB_0021dbe3;
    case 0xf:
      bVar20 = *(short *)a == 0;
LAB_0021db87:
      bVar20 = !bVar20;
      bVar21 = *(long *)l == 0;
      goto LAB_0021dbe3;
    case 0x10:
      bVar20 = *(long *)a == 0;
LAB_0021dbdb:
      bVar20 = !bVar20;
      bVar21 = *(short *)l == 0;
      goto LAB_0021dbe3;
    case 0x11:
      bVar20 = *(int *)a == 0;
LAB_0021db9f:
      bVar20 = !bVar20;
      bVar21 = *(long *)(l + 8) == 0 && *(long *)l == 0;
      goto LAB_0021dbe3;
    case 0x12:
      bVar20 = *(long *)(a + 8) == 0 && *(long *)a == 0;
      break;
    default:
      bVar20 = false;
      bVar21 = false;
      goto LAB_0021dbe6;
    }
    bVar20 = !bVar20;
    bVar21 = *(int *)l == 0;
LAB_0021dbe3:
    bVar21 = !bVar21;
LAB_0021dbe6:
    uVar12 = (uint)("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                    [txsize_to_bsize[uVar13]] <
                   "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[plane_bsize]) * 3 +
             (uint)bVar21 + (uint)bVar20 + 7;
    goto LAB_0021dc18;
  }
  uVar12 = (iVar11 - (uint)bVar20) + 8;
LAB_0021dc18:
  txb_ctx->txb_skip_ctx = uVar12;
  return;
}

Assistant:

static inline void get_txb_ctx(const BLOCK_SIZE plane_bsize,
                               const TX_SIZE tx_size, const int plane,
                               const ENTROPY_CONTEXT *const a,
                               const ENTROPY_CONTEXT *const l,
                               TXB_CTX *const txb_ctx) {
  switch (tx_size) {
    case TX_4X4: get_txb_ctx_4x4(plane_bsize, plane, a, l, txb_ctx); break;
    case TX_8X8: get_txb_ctx_8x8(plane_bsize, plane, a, l, txb_ctx); break;
    case TX_16X16: get_txb_ctx_16x16(plane_bsize, plane, a, l, txb_ctx); break;
    case TX_32X32: get_txb_ctx_32x32(plane_bsize, plane, a, l, txb_ctx); break;
    default:
      get_txb_ctx_general(plane_bsize, tx_size, plane, a, l, txb_ctx);
      break;
  }
}